

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseComplexTerminal(ParseContext *ctx)

{
  bool bVar1;
  LexemeType LVar2;
  SynDereference *this;
  Lexeme *pLVar3;
  Lexeme *pLVar4;
  SynBase *this_00;
  Lexeme *pLVar5;
  InplaceStr IVar6;
  InplaceStr value_1;
  bool isOperator;
  InplaceStr value;
  SynIdentifier *pSStack_30;
  uint groupLimit;
  SynBase *node;
  SynBase *node_1;
  Lexeme *start;
  ParseContext *ctx_local;
  
  pLVar4 = ctx->currentLexeme;
  bVar1 = ParseContext::Consume(ctx,lex_mul);
  if (bVar1) {
    node = ParseTerminal(ctx);
    if (node == (SynBase *)0x0) {
      pLVar5 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Report(ctx,pLVar5,"ERROR: expression not found after \'*\'");
      node = &ParseContext::get<SynError>(ctx)->super_SynBase;
      pLVar5 = ParseContext::Current(ctx);
      pLVar3 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)node,pLVar5,pLVar3);
    }
    this = ParseContext::get<SynDereference>(ctx);
    pLVar5 = ParseContext::Previous(ctx);
    SynDereference::SynDereference(this,pLVar4,pLVar5,node);
    return &this->super_SynBase;
  }
  pSStack_30 = (SynIdentifier *)0x0;
  bVar1 = ParseContext::Consume(ctx,lex_oparen);
  if (bVar1) {
    if (0xff < ctx->expressionGroupDepth) {
      pLVar5 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Stop(ctx,pLVar5,"ERROR: reached nested \'(\' limit of %d",0x100);
    }
    ctx->expressionGroupDepth = ctx->expressionGroupDepth + 1;
    pSStack_30 = (SynIdentifier *)ParseAssignment(ctx);
    ctx->expressionGroupDepth = ctx->expressionGroupDepth - 1;
    if (pSStack_30 == (SynIdentifier *)0x0) {
      pLVar5 = ParseContext::Current(ctx);
      anon_unknown.dwarf_fc7e::Report(ctx,pLVar5,"ERROR: expression not found after \'(\'");
      pSStack_30 = (SynIdentifier *)ParseContext::get<SynError>(ctx);
      pLVar5 = ParseContext::Current(ctx);
      pLVar3 = ParseContext::Current(ctx);
      SynError::SynError((SynError *)pSStack_30,pLVar5,pLVar3);
    }
    anon_unknown.dwarf_fc7e::CheckConsume
              (ctx,lex_cparen,"ERROR: closing \')\' not found after \'(\'");
  }
  if (pSStack_30 == (SynIdentifier *)0x0) {
    pSStack_30 = (SynIdentifier *)ParseString(ctx);
  }
  if (pSStack_30 == (SynIdentifier *)0x0) {
    pSStack_30 = (SynIdentifier *)ParseArray(ctx);
  }
  if (pSStack_30 == (SynIdentifier *)0x0) {
    pSStack_30 = (SynIdentifier *)ParseType(ctx,(bool *)0x0,false);
  }
  if ((pSStack_30 == (SynIdentifier *)0x0) && (bVar1 = ParseContext::At(ctx,lex_string), bVar1)) {
    IVar6 = ParseContext::Consume(ctx);
    pSStack_30 = ParseContext::get<SynIdentifier>(ctx);
    pLVar5 = ParseContext::Previous(ctx);
    SynIdentifier::SynIdentifier(pSStack_30,pLVar4,pLVar5,IVar6);
  }
  if ((pSStack_30 != (SynIdentifier *)0x0) || (bVar1 = ParseContext::Consume(ctx,lex_at), !bVar1))
  goto LAB_0011a986;
  LVar2 = ParseContext::Peek(ctx);
  if ((int)LVar2 < 9) {
LAB_0011a839:
    LVar2 = ParseContext::Peek(ctx);
    if (0x1d < (int)LVar2) {
      LVar2 = ParseContext::Peek(ctx);
      bVar1 = true;
      if ((int)LVar2 < 0x2a) goto LAB_0011a88c;
    }
    LVar2 = ParseContext::Peek(ctx);
    bVar1 = true;
    if (LVar2 != lex_bitnot) {
      LVar2 = ParseContext::Peek(ctx);
      bVar1 = LVar2 == lex_lognot;
    }
  }
  else {
    LVar2 = ParseContext::Peek(ctx);
    bVar1 = true;
    if (0x1d < (int)LVar2) goto LAB_0011a839;
  }
LAB_0011a88c:
  if (!bVar1) {
    pLVar4 = ParseContext::Current(ctx);
    anon_unknown.dwarf_fc7e::Report(ctx,pLVar4,"ERROR: name expected after \'@\'");
    this_00 = &ParseContext::get<SynError>(ctx)->super_SynBase;
    pLVar4 = ParseContext::Current(ctx);
    pLVar5 = ParseContext::Current(ctx);
    SynError::SynError((SynError *)this_00,pLVar4,pLVar5);
    return this_00;
  }
  IVar6 = ParseContext::Consume(ctx);
  pSStack_30 = ParseContext::get<SynIdentifier>(ctx);
  pLVar5 = ParseContext::Previous(ctx);
  SynIdentifier::SynIdentifier(pSStack_30,pLVar4,pLVar5,IVar6);
LAB_0011a986:
  if (pSStack_30 == (SynIdentifier *)0x0) {
    ctx_local = (ParseContext *)0x0;
  }
  else {
    ctx_local = (ParseContext *)ParsePostExpressions(ctx,&pSStack_30->super_SynBase);
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseComplexTerminal(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_mul))
	{
		SynBase *node = ParseTerminal(ctx);

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '*'");

			node = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		return new (ctx.get<SynDereference>()) SynDereference(start, ctx.Previous(), node);
	}

	SynBase *node = NULL;

	if(ctx.Consume(lex_oparen))
	{
		const unsigned groupLimit = 256;

		if(ctx.expressionGroupDepth >= groupLimit)
			Stop(ctx, ctx.Current(), "ERROR: reached nested '(' limit of %d", groupLimit);

		ctx.expressionGroupDepth++;

		node = ParseAssignment(ctx);

		ctx.expressionGroupDepth--;

		if(!node)
		{
			Report(ctx, ctx.Current(), "ERROR: expression not found after '('");

			node = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		CheckConsume(ctx, lex_cparen, "ERROR: closing ')' not found after '('");
	}

	if(!node)
		node = ParseString(ctx);

	if(!node)
		node = ParseArray(ctx);

	if(!node)
		node = ParseType(ctx);

	if(!node && ctx.At(lex_string))
	{
		InplaceStr value = ctx.Consume();

		node = new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), value);
	}

	if(!node && ctx.Consume(lex_at))
	{
		bool isOperator = (ctx.Peek() >= lex_add && ctx.Peek() <= lex_in) || (ctx.Peek() >= lex_set && ctx.Peek() <= lex_xorset) || ctx.Peek() == lex_bitnot || ctx.Peek() == lex_lognot;

		if(!isOperator)
		{
			Report(ctx, ctx.Current(), "ERROR: name expected after '@'");

			return new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
		}

		InplaceStr value = ctx.Consume();

		node = new (ctx.get<SynIdentifier>()) SynIdentifier(start, ctx.Previous(), value);
	}

	if(!node)
		return NULL;
		
	return ParsePostExpressions(ctx, node);
}